

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

wchar_t pick_trap(chunk_conflict2 *c,wchar_t feat,wchar_t trap_level)

{
  short sVar1;
  level_conflict *plVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint32_t uVar5;
  void *p;
  trap_kind_conflict *ptVar6;
  wchar_t local_4c;
  level *current;
  trap_kind_conflict *kind;
  wchar_t trap_prob_max;
  wchar_t *trap_probs;
  wchar_t pick;
  wchar_t i;
  wchar_t trap_level_local;
  wchar_t feat_local;
  chunk_conflict2 *c_local;
  
  kind._4_4_ = 0;
  _Var3 = feat_is_trap_holding(feat);
  if (_Var3) {
    if (c->depth == L'\0') {
      c_local._4_4_ = L'\xffffffff';
    }
    else {
      p = mem_zalloc((ulong)z_info->trap_max << 2);
      for (trap_probs._4_4_ = 0; trap_probs._4_4_ < (int)(uint)z_info->trap_max;
          trap_probs._4_4_ = trap_probs._4_4_ + 1) {
        ptVar6 = trap_info + trap_probs._4_4_;
        *(uint32_t *)((long)p + (long)trap_probs._4_4_ * 4) = kind._4_4_;
        if ((((((ptVar6->name != (char *)0x0) && (ptVar6->rarity != L'\0')) &&
              (_Var3 = flag_has_dbg(ptVar6->flags,3,2,"kind->flags","TRF_TRAP"), _Var3)) &&
             ((ptVar6->min_depth <= trap_level &&
              ((_Var3 = feat_is_tree(feat), !_Var3 ||
               (_Var3 = flag_has_dbg(ptVar6->flags,3,6,"kind->flags","TRF_TREE"), _Var3)))))) &&
            ((_Var3 = feat_is_floor(feat), !_Var3 ||
             (_Var3 = flag_has_dbg(ptVar6->flags,3,5,"kind->flags","TRF_FLOOR"), _Var3)))) &&
           ((wVar4 = level_topography((int)player->place), wVar4 == L'\a' ||
            (_Var3 = flag_has_dbg(ptVar6->flags,3,4,"kind->flags","TRF_DUNGEON"), !_Var3)))) {
          _Var3 = flag_has_dbg(ptVar6->flags,3,7,"kind->flags","TRF_DOWN");
          if (_Var3) {
            plVar2 = world->levels;
            sVar1 = player->place;
            _Var3 = quest_forbid_downstairs((int)player->place);
            if ((_Var3) ||
               (((plVar2[sVar1].down == (char *)0x0 &&
                 (_Var3 = underworld_possible(plVar2[sVar1].index), !_Var3)) ||
                (((player->opts).opt[0x2a] & 1U) != 0)))) goto LAB_0022563c;
          }
          *(int *)((long)p + (long)trap_probs._4_4_ * 4) =
               (int)(100 / (long)ptVar6->rarity) + *(int *)((long)p + (long)trap_probs._4_4_ * 4);
          kind._4_4_ = *(uint32_t *)((long)p + (long)trap_probs._4_4_ * 4);
        }
LAB_0022563c:
      }
      if (kind._4_4_ == 0) {
        mem_free(p);
        c_local._4_4_ = L'\xffffffff';
      }
      else {
        uVar5 = Rand_div(kind._4_4_);
        trap_probs._4_4_ = L'\0';
        while ((trap_probs._4_4_ < (int)(uint)z_info->trap_max &&
               (*(int *)((long)p + (long)trap_probs._4_4_ * 4) <= (int)uVar5))) {
          trap_probs._4_4_ = trap_probs._4_4_ + L'\x01';
        }
        mem_free(p);
        if (trap_probs._4_4_ < (int)(uint)z_info->trap_max) {
          local_4c = trap_probs._4_4_;
        }
        else {
          local_4c = L'\xffffffff';
        }
        c_local._4_4_ = local_4c;
      }
    }
  }
  else {
    c_local._4_4_ = L'\xffffffff';
  }
  return c_local._4_4_;
}

Assistant:

static int pick_trap(struct chunk *c, int feat, int trap_level)
{
    int i, pick;
	int *trap_probs = NULL;
	int trap_prob_max = 0;

    /* Paranoia */
    if (!feat_is_trap_holding(feat))
		return -1;

    /* No traps in town */
    if (c->depth == 0)
		return -1;

    /* Get trap probabilities */
	trap_probs = mem_zalloc(z_info->trap_max * sizeof(int));
	for (i = 0; i < z_info->trap_max; i++) {
		/* Get this trap */
		struct trap_kind *kind = &trap_info[i];
		trap_probs[i] = trap_prob_max;

		/* Ensure that this is a valid player trap */
		if (!kind->name) continue;
		if (!kind->rarity) continue;
		if (!trf_has(kind->flags, TRF_TRAP)) continue;

		/* Require that trap_level not be too low */
		if (kind->min_depth > trap_level) continue;

		/* Tree? */
		if (feat_is_tree(feat) && !trf_has(kind->flags, TRF_TREE))
			continue;

		/* Floor? */
		if (feat_is_floor(feat) && !trf_has(kind->flags, TRF_FLOOR))
			continue;

		/* Dungeon? */
		if ((level_topography(player->place) != TOP_CAVE) &&
			trf_has(kind->flags, TRF_DUNGEON))
			continue;

		/* Check legality of trapdoors. */
		if (trf_has(kind->flags, TRF_DOWN)) {
			struct level *current = &world->levels[player->place];
			
			/* No trap doors on quest levels */
			if (quest_forbid_downstairs(player->place)) continue;

			/* No trap doors on the deepest level */
			if (!current->down && !underworld_possible(current->index))
				continue;

			/* No trap doors with persistent levels (for now) */
			if (OPT(player, birth_levels_persist))
				continue;
	    }

		/* Trap is okay, store the cumulative probability */
		trap_probs[i] += (100 / kind->rarity);
		trap_prob_max = trap_probs[i];
	}

	/* No valid trap */
	if (trap_prob_max == 0) {
		mem_free(trap_probs);
		return -1;
	}

	/* Pick at random. */
	pick = randint0(trap_prob_max);
	for (i = 0; i < z_info->trap_max; i++) {
		if (pick < trap_probs[i]) {
			break;
		}
	}

	mem_free(trap_probs);

    /* Return our chosen trap */
    return i < z_info->trap_max ? i : -1;
}